

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::option_with_value<unsigned_int>::option_with_value
          (option_with_value<unsigned_int> *this,string *name,char short_name,bool need,uint *def,
          string *desc)

{
  byte in_CL;
  undefined1 in_DL;
  string *in_RSI;
  option_base *in_RDI;
  undefined4 *in_R8;
  string *in_stack_000000a0;
  option_with_value<unsigned_int> *in_stack_000000a8;
  string local_58 [56];
  undefined4 *local_20;
  byte local_12;
  undefined1 local_11;
  string *local_10;
  
  local_12 = in_CL & 1;
  local_20 = in_R8;
  local_11 = in_DL;
  local_10 = in_RSI;
  option_base::option_base(in_RDI);
  in_RDI->_vptr_option_base = (_func_int **)&PTR__option_with_value_00258518;
  std::__cxx11::string::string((string *)(in_RDI + 1),local_10);
  *(undefined1 *)&in_RDI[5]._vptr_option_base = local_11;
  *(byte *)((long)&in_RDI[5]._vptr_option_base + 1) = local_12 & 1;
  std::__cxx11::string::string((string *)(in_RDI + 6));
  *(undefined1 *)&in_RDI[10]._vptr_option_base = 0;
  *(undefined4 *)((long)&in_RDI[10]._vptr_option_base + 4) = *local_20;
  *(undefined4 *)&in_RDI[0xb]._vptr_option_base = *local_20;
  full_description(in_stack_000000a8,in_stack_000000a0);
  std::__cxx11::string::operator=((string *)(in_RDI + 6),local_58);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

option_with_value(const std::string& name, char short_name, bool need, const T& def, const std::string& desc)
            : nam(name), snam(short_name), need(need), has(false), def(def), actual(def) {
            this->desc = full_description(desc);
        }